

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O0

void pstore::exchange::export_ns::emit_compilation_index
               (ostream_base *os,indent ind,database *db,uint generation,string_mapping *strings,
               bool comments)

{
  bool bVar1;
  element_type *peVar2;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_compilation_cpp:96:37)>
  out;
  undefined1 local_90 [8];
  anon_class_56_7_4f9db7a2 out_fn;
  char *sep;
  undefined1 local_48 [8];
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  bool comments_local;
  string_mapping *strings_local;
  uint generation_local;
  database *db_local;
  ostream_base *os_local;
  indent ind_local;
  
  compilations.
  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = comments;
  os_local._4_4_ = ind.distance_;
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)local_48,db,true);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    bVar1 = pstore::index::
            hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::empty(peVar2);
    if ((!bVar1) && (generation != 0)) {
      out_fn.comments = (bool *)0x2fa8e3;
      local_90 = (undefined1  [8])local_48;
      out_fn.os = (ostream_base *)&out_fn.comments;
      out_fn.sep = (char **)((long)&os_local + 4);
      out_fn.strings =
           (string_mapping *)
           ((long)&compilations.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi + 7);
      out_fn.compilations =
           (shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            *)db;
      out_fn.db = (database *)os;
      out_fn.ind = (indent *)strings;
      peVar2 = std::
               __shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_90);
      out = make_diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>
                      ((anon_class_56_7_4f9db7a2 *)local_90);
      diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                (db,peVar2,generation - 1,out);
    }
  }
  std::
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)local_48);
  return;
}

Assistant:

void emit_compilation_index (ostream_base & os, indent const ind, database const & db,
                                         unsigned const generation, string_mapping const & strings,
                                         bool const comments) {
                auto const compilations = index::get_index<trailer::indices::compilation> (db);
                if (!compilations || compilations->empty ()) {
                    return;
                }
                if (generation == 0) {
                    // The first (zeroth) transaction in the store is, by definition, empty.
                    return;
                }
                auto const * sep = "\n";

                auto const out_fn = [&] (address const addr) {
                    auto const & kvp = compilations->load_leaf_node (db, addr);
                    os << sep << ind;
                    emit_digest (os, kvp.first);
                    os << ':';
                    emit_compilation (os, ind, db, *db.getro (kvp.second), strings, comments);
                    sep = ",\n";
                };
                diff (db, *compilations, generation - 1U, make_diff_out (&out_fn));
            }